

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostcheckPass.cpp
# Opt level: O1

PreservedAnalyses * __thiscall
Postcheck::run(PreservedAnalyses *__return_storage_ptr__,Postcheck *this,Module *M,
              ModuleAnalysisManager *AM)

{
  char cVar1;
  long *plVar2;
  CallGraph *pCVar3;
  CallGraph *pCVar4;
  Module *pMVar5;
  Module *pMVar6;
  Module *pMVar7;
  Module *pMVar8;
  Module *pMVar9;
  char *pcVar10;
  CallGraph *pCVar11;
  bool bVar12;
  StringRef SVar13;
  undefined1 auVar14 [16];
  StringRef local_b8;
  Twine local_a8;
  Twine local_80;
  Twine local_58;
  
  pMVar5 = *(Module **)(M + 0x20);
  if (pMVar5 == M + 0x18) {
    pMVar6 = (Module *)0x0;
  }
  else {
    pMVar6 = (Module *)0x0;
    do {
      pMVar7 = pMVar5 + -0x38;
      if (pMVar5 == (Module *)0x0) {
        pMVar7 = (Module *)0x0;
      }
      if ((((byte)pMVar7[0x21] & 0x20) == 0) &&
         (bVar12 = pMVar6 != (Module *)0x0, pMVar6 = pMVar7, bVar12)) {
        pcVar10 = "More than one function in module!";
        goto LAB_0011a384;
      }
      pMVar5 = *(Module **)(pMVar5 + 8);
    } while (pMVar5 != M + 0x18);
  }
  if (pMVar6 != (Module *)0x0) {
    SVar13.Length = (size_t)"shellvm-main";
    SVar13.Data = (char *)pMVar6;
    cVar1 = llvm::Function::hasFnAttribute(SVar13);
    if (cVar1 == '\0') {
      local_b8 = (StringRef)llvm::Value::getName();
      llvm::operator+(&local_80,"SheLLVM main function ",&local_b8);
      llvm::Twine::Twine(&local_a8," has no shellvm-main attribute!");
      llvm::operator+(&local_58,&local_80,&local_a8);
      llvm::report_fatal_error(&local_58,true);
    }
    else {
      for (pMVar5 = *(Module **)(M + 0x10); pMVar5 != M + 8; pMVar5 = *(Module **)(pMVar5 + 8)) {
        pMVar7 = pMVar5 + -0x38;
        if (pMVar5 == (Module *)0x0) {
          pMVar7 = (Module *)0x0;
        }
        if (((byte)pMVar7[0x22] & 0x40) == 0) {
          plVar2 = (long *)0x0;
          bVar12 = false;
        }
        else {
          auVar14 = llvm::GlobalObject::getSectionImpl();
          plVar2 = auVar14._0_8_;
          bVar12 = auVar14._8_8_ == 0xd;
        }
        if (!bVar12) goto LAB_0011a38e;
        if (*(long *)((long)plVar2 + 5) != 0x617461646174656d || *plVar2 != 0x74656d2e6d766c6c)
        goto LAB_0011a38e;
      }
      for (pMVar5 = *(Module **)(pMVar6 + 0x50); pMVar5 != pMVar6 + 0x48;
          pMVar5 = *(Module **)(pMVar5 + 8)) {
        pMVar7 = pMVar5 + -0x18;
        if (pMVar5 == (Module *)0x0) {
          pMVar7 = (Module *)0x0;
        }
        for (pMVar8 = *(Module **)(pMVar7 + 0x30); pMVar8 != pMVar7 + 0x28;
            pMVar8 = *(Module **)(pMVar8 + 8)) {
          pMVar9 = pMVar8 + -0x18;
          if (pMVar8 == (Module *)0x0) {
            pMVar9 = (Module *)0x0;
          }
          if (pMVar9[0x10] == (Module)0x1e) {
            pcVar10 = "Switch instruction found within main function.";
            goto LAB_0011a384;
          }
        }
      }
      pCVar3 = (CallGraph *)operator_new(0x48);
      llvm::CallGraph::CallGraph(pCVar3,M);
      pCVar11 = pCVar3 + 0x10;
      pCVar4 = pCVar11;
      for (pCVar3 = *(CallGraph **)(pCVar3 + 0x18); pCVar3 != (CallGraph *)0x0;
          pCVar3 = *(CallGraph **)
                    (pCVar3 + (ulong)(*(Module **)(pCVar3 + 0x20) < pMVar6) * 8 + 0x10)) {
        if (*(Module **)(pCVar3 + 0x20) >= pMVar6) {
          pCVar4 = pCVar3;
        }
      }
      pCVar3 = pCVar11;
      if ((pCVar4 != pCVar11) && (pCVar3 = pCVar4, pMVar6 < *(Module **)(pCVar4 + 0x20))) {
        pCVar3 = pCVar11;
      }
      if (pCVar3 != pCVar11) {
        bVar12 = dfsTraverse(this,*(CallGraphNode **)(pCVar3 + 0x28));
        if (bVar12) {
          llvm::PreservedAnalyses::all();
          return __return_storage_ptr__;
        }
        pcVar10 = "Non-intrinsic external call found within main function!";
        goto LAB_0011a384;
      }
    }
    __assert_fail("I != FunctionMap.end() && \"Function not in callgraph!\"",
                  "/usr/lib/llvm-14/include/llvm/Analysis/CallGraph.h",0x7a,
                  "CallGraphNode *llvm::CallGraph::operator[](const Function *)");
  }
  pcVar10 = "No functions found in module!";
LAB_0011a384:
  do {
    llvm::report_fatal_error(pcVar10,true);
LAB_0011a38e:
    pcVar10 = "Module has global variables!";
  } while( true );
}

Assistant:

llvm::PreservedAnalyses Postcheck::run(Module &M, ModuleAnalysisManager &AM) {
  // Check 1: Make sure we only have a single function, with the attribute
  // shellvm-main.
  Function *mainFunc = nullptr;

  for (Function &f : M.functions()) {
    if (f.isIntrinsic()) {
      continue;
    }

    if (mainFunc) {
      report_fatal_error("More than one function in module!");
      mainFunc = nullptr;
      continue;
    }

    mainFunc = &f;
  }

  if (!mainFunc) {
    report_fatal_error("No functions found in module!");
  }

  if (mainFunc && !mainFunc->hasFnAttribute("shellvm-main")) {
    report_fatal_error("SheLLVM main function " + mainFunc->getName() +
                       " has no shellvm-main attribute!");
  }

  // Check 2: Make sure there are no globals.
  for (GlobalVariable &global : M.getGlobalList()) {
    if (!global.getSection().equals("llvm.metadata")) {
      report_fatal_error("Module has global variables!");
    }
  }

  // Check 3: No switch instructions allowed in function body.
  if (mainFunc) {
    for (BasicBlock &BB : *mainFunc) {
      for (Instruction &I : BB) {
        if (isa<SwitchInst>(I)) {
          report_fatal_error("Switch instruction found within main function.");
        }
      }
    }

    // Check 4: No external calls (that aren't LLVM intrinsics).
    CallGraph *cg = new CallGraph(M);
    CallGraphNode *cgn = cg->operator[](mainFunc);
    if (!dfsTraverse(cgn)) {
      report_fatal_error(
          "Non-intrinsic external call found within main function!");
    }
  }

  return llvm::PreservedAnalyses::all();
}